

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Shape *shape;
  Image render;
  Image IStack_88;
  string local_78;
  Scene local_58;
  
  local_58.camera.origin.x = 0.0;
  local_58.camera.origin.y = 0.0;
  local_58.camera.origin.z = 0.0;
  local_58.lights.super__Vector_base<Raytracer::Light,_std::allocator<Raytracer::Light>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.lights.super__Vector_base<Raytracer::Light,_std::allocator<Raytracer::Light>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_58.lights.super__Vector_base<Raytracer::Light,_std::allocator<Raytracer::Light>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_58.objects.super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.lights.super__Vector_base<Raytracer::Light,_std::allocator<Raytracer::Light>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.objects.super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.objects.super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.camera.fov = 1.0471976;
  shape = (Shape *)operator_new(0x18);
  shape->_vptr_Shape = (_func_int **)&PTR__Sphere_00104d78;
  shape[1]._vptr_Shape = (_func_int **)0x0;
  shape[2]._vptr_Shape = (_func_int **)0x41200000c25c0000;
  Raytracer::Scene::addObject(&local_58,shape);
  Raytracer::Image::Image(&IStack_88,1000,1000);
  Raytracer::Scene::start(&local_58,&IStack_88);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"./file1.ppm","");
  Raytracer::Image::Save(&IStack_88,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Raytracer::Image::~Image(&IStack_88);
  Raytracer::Scene::~Scene(&local_58);
  return 0;
}

Assistant:

int main() {
    Raytracer::Scene scene(Raytracer::Camera(Vec3f(0,0,0)));
    scene.addObject(new Raytracer::Sphere(Vec3f(0,0,-55),10));
    Raytracer::Image render(1000,1000);
    scene.start(render);
    render.Save("./file1.ppm");
    return 0;
}